

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ExtensionDescriptorTest_ExtensionRanges_Test::
~ExtensionDescriptorTest_ExtensionRanges_Test(ExtensionDescriptorTest_ExtensionRanges_Test *this)

{
  ExtensionDescriptorTest::~ExtensionDescriptorTest(&this->super_ExtensionDescriptorTest);
  operator_delete(this,0xb0);
  return;
}

Assistant:

TEST_F(ExtensionDescriptorTest, ExtensionRanges) {
  EXPECT_EQ(0, bar_->extension_range_count());
  ASSERT_EQ(2, foo_->extension_range_count());

  EXPECT_EQ(10, foo_->extension_range(0)->start_number());
  EXPECT_EQ(30, foo_->extension_range(1)->start_number());

  EXPECT_EQ(20, foo_->extension_range(0)->end_number());
  EXPECT_EQ(40, foo_->extension_range(1)->end_number());
}